

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qteamcitylogger.cpp
# Opt level: O0

void __thiscall QTeamCityLogger::startLogging(QTeamCityLogger *this)

{
  long lVar1;
  char *pcVar2;
  char *msg;
  QTestCharBuffer *pQVar3;
  QAbstractTestLogger *in_RDI;
  long in_FS_OFFSET;
  QTestCharBuffer buf;
  QTestCharBuffer *in_stack_fffffffffffffdc8;
  QTeamCityLogger *in_stack_fffffffffffffdd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractTestLogger::startLogging(in_RDI);
  pQVar3 = (QTestCharBuffer *)(in_RDI + 0x43);
  QTestResult::currentTestObjectName();
  tcEscapedString(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,(char *)pQVar3);
  memset((QTestCharBuffer *)&stack0xfffffffffffffde8,0xaa,0x210);
  QTestCharBuffer::QTestCharBuffer((QTestCharBuffer *)&stack0xfffffffffffffde8);
  pcVar2 = QTestCharBuffer::constData(pQVar3);
  msg = QTestCharBuffer::constData((QTestCharBuffer *)(in_RDI + 0x43));
  QTest::qt_asprintf((QTestCharBuffer *)&stack0xfffffffffffffde8,
                     "##teamcity[testSuiteStarted name=\'%s\' flowId=\'%s\']\n",pcVar2,msg);
  pQVar3 = (QTestCharBuffer *)
           QTestCharBuffer::constData((QTestCharBuffer *)&stack0xfffffffffffffde8);
  QAbstractTestLogger::outputString(in_RDI,msg);
  QTestCharBuffer::~QTestCharBuffer(pQVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTeamCityLogger::startLogging()
{
    QAbstractTestLogger::startLogging();

    tcEscapedString(&flowID, QTestResult::currentTestObjectName());

    QTestCharBuffer buf;
    QTest::qt_asprintf(&buf, "##teamcity[testSuiteStarted name='%s' flowId='%s']\n",
                       flowID.constData(), flowID.constData());
    outputString(buf.constData());
}